

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O1

operation_t * op_get(int symbol,int ver)

{
  operation_t *poVar1;
  bool bVar2;
  operation_t *poVar3;
  int iVar4;
  
  switch(ver) {
  case 2:
  case 3:
    poVar3 = ops_v2_v3;
    break;
  case 4:
  case 7:
    poVar3 = ops_v4_v7;
    break;
  default:
    bVar2 = true;
    poVar3 = (operation_t *)0x0;
    goto LAB_001115b3;
  case 8:
    poVar3 = ops_v8;
  }
  bVar2 = false;
LAB_001115b3:
  if (!bVar2) {
    iVar4 = poVar3->symbol;
    while (iVar4 != 0) {
      if (iVar4 == symbol) {
        return poVar3;
      }
      poVar1 = poVar3 + 1;
      poVar3 = poVar3 + 1;
      iVar4 = poVar1->symbol;
    }
  }
  return (operation_t *)0x0;
}

Assistant:

const operation_t*
op_get(
    int symbol,
    int ver
) {
    const operation_t* table = op_get_table(ver);
    if (table != NULL) {
        while(table->symbol) {
            if (table->symbol == symbol)
                return table;
            ++table;
        }
    }
    return NULL;
}